

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O0

LY_ERR parse_orderedby(lysp_yang_ctx *ctx,lysp_node *llist)

{
  int iVar1;
  char *pcVar2;
  ly_ctx *local_70;
  ly_ctx *local_60;
  ly_ctx *local_58;
  ly_ctx *local_50;
  bool local_45;
  ly_stmt local_44;
  ly_bool __loop_end;
  ulong uStack_40;
  ly_stmt kw;
  size_t word_len;
  char *word;
  char *buf;
  lysp_node *plStack_20;
  LY_ERR ret;
  lysp_node *llist_local;
  lysp_yang_ctx *ctx_local;
  
  buf._4_4_ = 0;
  word = (char *)0x0;
  plStack_20 = llist;
  llist_local = (lysp_node *)ctx;
  if ((llist->flags & 0xc0) != 0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      local_50 = (ly_ctx *)0x0;
    }
    else {
      local_50 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    ly_vlog(local_50,(char *)0x0,LYVE_SYNTAX_YANG,"Duplicate keyword \"%s\".","ordered-by");
    return LY_EVALID;
  }
  buf._4_4_ = get_argument(ctx,Y_STR_ARG,(uint16_t *)0x0,(char **)&word_len,&word,
                           &stack0xffffffffffffffc0);
  if (buf._4_4_ == LY_SUCCESS) {
    if ((uStack_40 == 6) && (iVar1 = strncmp((char *)word_len,"system",6), iVar1 == 0)) {
      plStack_20->flags = plStack_20->flags | 0x80;
    }
    else {
      if ((uStack_40 != 4) || (iVar1 = strncmp((char *)word_len,"user",4), iVar1 != 0)) {
        if (llist_local == (lysp_node *)0x0) {
          local_58 = (ly_ctx *)0x0;
        }
        else {
          local_58 = *(ly_ctx **)
                      **(undefined8 **)
                        (llist_local->exts->argument +
                        (ulong)(*(int *)((long)&llist_local->exts->name + 4) - 1) * 8);
        }
        ly_vlog(local_58,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid value \"%.*s\" of \"%s\".",
                uStack_40 & 0xffffffff,word_len,"ordered-by");
        buf._4_4_ = LY_EVALID;
        goto LAB_001c1f28;
      }
      plStack_20->flags = plStack_20->flags | 0x40;
    }
    buf._4_4_ = get_keyword((lysp_yang_ctx *)llist_local,&local_44,(char **)&word_len,
                            &stack0xffffffffffffffc0);
    if (buf._4_4_ == LY_SUCCESS) {
      if (local_44 == LY_STMT_SYNTAX_SEMICOLON) {
        local_45 = true;
      }
      else {
        if (local_44 != LY_STMT_SYNTAX_LEFT_BRACE) {
          if (llist_local == (lysp_node *)0x0) {
            local_60 = (ly_ctx *)0x0;
          }
          else {
            local_60 = *(ly_ctx **)
                        **(undefined8 **)
                          (llist_local->exts->argument +
                          (ulong)(*(int *)((long)&llist_local->exts->name + 4) - 1) * 8);
          }
          pcVar2 = lyplg_ext_stmt2str(local_44);
          ly_vlog(local_60,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar2);
          buf._4_4_ = LY_EVALID;
          goto LAB_001c1f28;
        }
        buf._4_4_ = get_keyword((lysp_yang_ctx *)llist_local,&local_44,(char **)&word_len,
                                &stack0xffffffffffffffc0);
        if (buf._4_4_ != LY_SUCCESS) goto LAB_001c1f28;
        local_45 = local_44 == LY_STMT_SYNTAX_RIGHT_BRACE;
      }
      while (!local_45) {
        if (local_44 != LY_STMT_EXTENSION_INSTANCE) {
          if (llist_local == (lysp_node *)0x0) {
            local_70 = (ly_ctx *)0x0;
          }
          else {
            local_70 = *(ly_ctx **)
                        **(undefined8 **)
                          (llist_local->exts->argument +
                          (ulong)(*(int *)((long)&llist_local->exts->name + 4) - 1) * 8);
          }
          pcVar2 = lyplg_ext_stmt2str(local_44);
          ly_vlog(local_70,(char *)0x0,LYVE_SYNTAX_YANG,
                  "Invalid keyword \"%s\" as a child of \"%s\".",pcVar2,"ordered-by");
          buf._4_4_ = LY_EVALID;
          break;
        }
        buf._4_4_ = parse_ext((lysp_yang_ctx *)llist_local,(char *)word_len,uStack_40,plStack_20,
                              LY_STMT_ORDERED_BY,0,&plStack_20->exts);
        if ((buf._4_4_ != LY_SUCCESS) ||
           (buf._4_4_ = get_keyword((lysp_yang_ctx *)llist_local,&local_44,(char **)&word_len,
                                    &stack0xffffffffffffffc0), buf._4_4_ != LY_SUCCESS)) break;
        if (local_44 == LY_STMT_SYNTAX_RIGHT_BRACE) {
          local_45 = true;
        }
      }
    }
  }
LAB_001c1f28:
  free(word);
  return buf._4_4_;
}

Assistant:

static LY_ERR
parse_orderedby(struct lysp_yang_ctx *ctx, struct lysp_node *llist)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf = NULL, *word;
    size_t word_len;
    enum ly_stmt kw;

    if (llist->flags & LYS_ORDBY_MASK) {
        LOGVAL_PARSER(ctx, LY_VCODE_DUPSTMT, "ordered-by");
        return LY_EVALID;
    }

    /* get value */
    LY_CHECK_GOTO(ret = get_argument(ctx, Y_STR_ARG, NULL, &word, &buf, &word_len), cleanup);

    if ((word_len == ly_strlen_const("system")) && !strncmp(word, "system", word_len)) {
        llist->flags |= LYS_ORDBY_SYSTEM;
    } else if ((word_len == ly_strlen_const("user")) && !strncmp(word, "user", word_len)) {
        llist->flags |= LYS_ORDBY_USER;
    } else {
        LOGVAL_PARSER(ctx, LY_VCODE_INVAL, (int)word_len, word, "ordered-by");
        ret = LY_EVALID;
        goto cleanup;
    }

    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_GOTO(ret = parse_ext(ctx, word, word_len, llist, LY_STMT_ORDERED_BY, 0, &llist->exts), cleanup);
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "ordered-by");
            ret = LY_EVALID;
            goto cleanup;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, NULL, ret, cleanup);
    }

cleanup:
    free(buf);
    return ret;
}